

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O0

void test_gzio(char *fname,Byte *uncompr,uLong uncomprLen)

{
  byte *pbVar1;
  FILE *pFVar2;
  int iVar3;
  size_t sVar4;
  long lVar5;
  undefined8 uVar6;
  int *piVar7;
  long lVar8;
  uint local_64;
  off_t pos;
  gzFile file;
  int len;
  int err;
  uLong uncomprLen_local;
  Byte *uncompr_local;
  char *fname_local;
  
  _len = uncomprLen;
  uncomprLen_local = (uLong)uncompr;
  uncompr_local = (Byte *)fname;
  sVar4 = strlen(hello);
  file._0_4_ = (int)sVar4 + 1;
  lVar5 = gzopen(uncompr_local,"wb");
  if (lVar5 == 0) {
    fprintf(_stderr,"gzopen error\n");
    exit(1);
  }
  gzputc(lVar5,0x68);
  iVar3 = gzputs(lVar5,"ello");
  pFVar2 = _stderr;
  if (iVar3 != 4) {
    uVar6 = gzerror(lVar5,(long)&file + 4);
    fprintf(pFVar2,"gzputs err: %s\n",uVar6);
    exit(1);
  }
  iVar3 = gzprintf(lVar5,", %s!","hello");
  pFVar2 = _stderr;
  if (iVar3 != 8) {
    uVar6 = gzerror(lVar5,(long)&file + 4);
    fprintf(pFVar2,"gzprintf err: %s\n",uVar6);
    exit(1);
  }
  gzseek(lVar5,1,1);
  gzclose(lVar5);
  piVar7 = (int *)gzopen(uncompr_local,"rb");
  if (piVar7 == (int *)0x0) {
    fprintf(_stderr,"gzopen error\n");
    exit(1);
  }
  strcpy((char *)uncomprLen_local,"garbage");
  iVar3 = gzread(piVar7,uncomprLen_local,_len & 0xffffffff);
  pFVar2 = _stderr;
  if (iVar3 != (int)file) {
    uVar6 = gzerror(piVar7,(long)&file + 4);
    fprintf(pFVar2,"gzread err: %s\n",uVar6);
    exit(1);
  }
  iVar3 = strcmp((char *)uncomprLen_local,hello);
  if (iVar3 != 0) {
    fprintf(_stderr,"bad gzread: %s\n",uncomprLen_local);
    exit(1);
  }
  printf("gzread(): %s\n",uncomprLen_local);
  lVar5 = gzseek(piVar7,0xfffffffffffffff8,1);
  if (lVar5 == 6) {
    lVar8 = gztell(piVar7);
    if (lVar8 == 6) {
      if (*piVar7 == 0) {
        local_64 = gzgetc(piVar7);
      }
      else {
        *piVar7 = *piVar7 + -1;
        *(long *)(piVar7 + 4) = *(long *)(piVar7 + 4) + 1;
        pbVar1 = *(byte **)(piVar7 + 2);
        *(byte **)(piVar7 + 2) = pbVar1 + 1;
        local_64 = (uint)*pbVar1;
      }
      if (local_64 != 0x20) {
        fprintf(_stderr,"gzgetc error\n");
        exit(1);
      }
      iVar3 = gzungetc(0x20,piVar7);
      if (iVar3 != 0x20) {
        fprintf(_stderr,"gzungetc error\n");
        exit(1);
      }
      gzgets(piVar7,uncomprLen_local,_len & 0xffffffff);
      sVar4 = strlen((char *)uncomprLen_local);
      pFVar2 = _stderr;
      if (sVar4 != 7) {
        uVar6 = gzerror(piVar7,(long)&file + 4);
        fprintf(pFVar2,"gzgets err after gzseek: %s\n",uVar6);
        exit(1);
      }
      iVar3 = strcmp((char *)uncomprLen_local,hello + 6);
      if (iVar3 != 0) {
        fprintf(_stderr,"bad gzgets after gzseek\n");
        exit(1);
      }
      printf("gzgets() after gzseek: %s\n",uncomprLen_local);
      gzclose(piVar7);
      return;
    }
  }
  pFVar2 = _stderr;
  uVar6 = gztell(piVar7);
  fprintf(pFVar2,"gzseek error, pos=%ld, gztell=%ld\n",lVar5,uVar6);
  exit(1);
}

Assistant:

void test_gzio(fname, uncompr, uncomprLen)
    const char *fname; /* compressed file name */
    Byte *uncompr;
    uLong uncomprLen;
{
#ifdef NO_GZCOMPRESS
    fprintf(stderr, "NO_GZCOMPRESS -- gz* functions cannot compress\n");
#else
    int err;
    int len = (int)strlen(hello)+1;
    gzFile file;
    z_off_t pos;

    file = gzopen(fname, "wb");
    if (file == NULL) {
        fprintf(stderr, "gzopen error\n");
        exit(1);
    }
    gzputc(file, 'h');
    if (gzputs(file, "ello") != 4) {
        fprintf(stderr, "gzputs err: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (gzprintf(file, ", %s!", "hello") != 8) {
        fprintf(stderr, "gzprintf err: %s\n", gzerror(file, &err));
        exit(1);
    }
    gzseek(file, 1L, SEEK_CUR); /* add one zero byte */
    gzclose(file);

    file = gzopen(fname, "rb");
    if (file == NULL) {
        fprintf(stderr, "gzopen error\n");
        exit(1);
    }
    strcpy((char*)uncompr, "garbage");

    if (gzread(file, uncompr, (unsigned)uncomprLen) != len) {
        fprintf(stderr, "gzread err: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (strcmp((char*)uncompr, hello)) {
        fprintf(stderr, "bad gzread: %s\n", (char*)uncompr);
        exit(1);
    } else {
        printf("gzread(): %s\n", (char*)uncompr);
    }

    pos = gzseek(file, -8L, SEEK_CUR);
    if (pos != 6 || gztell(file) != pos) {
        fprintf(stderr, "gzseek error, pos=%ld, gztell=%ld\n",
                (long)pos, (long)gztell(file));
        exit(1);
    }

    if (gzgetc(file) != ' ') {
        fprintf(stderr, "gzgetc error\n");
        exit(1);
    }

    if (gzungetc(' ', file) != ' ') {
        fprintf(stderr, "gzungetc error\n");
        exit(1);
    }

    gzgets(file, (char*)uncompr, (int)uncomprLen);
    if (strlen((char*)uncompr) != 7) { /* " hello!" */
        fprintf(stderr, "gzgets err after gzseek: %s\n", gzerror(file, &err));
        exit(1);
    }
    if (strcmp((char*)uncompr, hello + 6)) {
        fprintf(stderr, "bad gzgets after gzseek\n");
        exit(1);
    } else {
        printf("gzgets() after gzseek: %s\n", (char*)uncompr);
    }

    gzclose(file);
#endif
}